

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

int run_test_we_get_signals(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  long lVar3;
  ulong *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc [2];
  signal_ctx sc [4];
  ulong uStack_790;
  timer_ctx tStack_788;
  signal_ctx sStack_700;
  signal_ctx sStack_678;
  signal_ctx sStack_5f0;
  signal_ctx sStack_568;
  uv_loop_t *puStack_4d8;
  ulong uStack_488;
  ulong uStack_480;
  timer_ctx tStack_478;
  signal_ctx sStack_3f0;
  uv_loop_t *puStack_368;
  timer_ctx *ptStack_360;
  ulong local_358;
  ulong local_350;
  timer_ctx local_348;
  timer_ctx tStack_2c0;
  signal_ctx local_238;
  signal_ctx sStack_1b0;
  signal_ctx local_128;
  signal_ctx local_a0;
  
  ptStack_360 = (timer_ctx *)0x1bd59f;
  puVar2 = (uv_loop_t *)uv_default_loop();
  ptStack_360 = (timer_ctx *)0x1bd5bc;
  start_watcher(puVar2,10,&local_238,0);
  ptStack_360 = (timer_ctx *)0x1bd5d7;
  start_watcher(puVar2,10,&sStack_1b0,0);
  ptStack_360 = (timer_ctx *)0x1bd5ee;
  start_watcher(puVar2,0xc,&local_128,0);
  ptStack_360 = (timer_ctx *)0x1bd605;
  start_watcher(puVar2,0xc,&local_a0,0);
  ptStack_360 = (timer_ctx *)0x1bd61a;
  start_timer(puVar2,10,&local_348);
  ptStack_360 = (timer_ctx *)0x1bd62d;
  start_timer(puVar2,0xc,&tStack_2c0);
  ptStack_360 = (timer_ctx *)0x1bd637;
  iVar1 = uv_run(puVar2,0);
  local_350 = (ulong)iVar1;
  local_358 = 0;
  if (local_350 != 0) goto LAB_001bd721;
  lVar3 = 4;
  do {
    local_350 = (ulong)*(uint *)((long)&local_238.stop_or_close + lVar3);
    local_358 = 10;
    if (local_350 != 10) {
      ptStack_360 = (timer_ctx *)0x1bd714;
      run_test_we_get_signals_cold_2();
      goto LAB_001bd714;
    }
    lVar3 = lVar3 + 0x88;
  } while (lVar3 != 0x224);
  lVar3 = 0;
  do {
    local_350 = (ulong)*(uint *)((long)&local_348.ncalls + lVar3);
    local_358 = 10;
    if (local_350 != 10) goto LAB_001bd714;
    lVar3 = lVar3 + 0x88;
  } while (lVar3 == 0x88);
  ptStack_360 = (timer_ctx *)0x1bd6c7;
  uv_walk(puVar2,close_walk_cb,0);
  ptStack_360 = (timer_ctx *)0x1bd6d1;
  uv_run(puVar2,0);
  local_350 = 0;
  ptStack_360 = (timer_ctx *)0x1bd6e2;
  iVar1 = uv_loop_close(puVar2);
  local_358 = (ulong)iVar1;
  if (local_350 == local_358) {
    ptStack_360 = (timer_ctx *)0x1bd6f8;
    uv_library_shutdown();
    return 0;
  }
  goto LAB_001bd72e;
LAB_001bd714:
  ptStack_360 = (timer_ctx *)0x1bd721;
  run_test_we_get_signals_cold_3();
LAB_001bd721:
  ptStack_360 = (timer_ctx *)0x1bd72e;
  run_test_we_get_signals_cold_1();
LAB_001bd72e:
  ptStack_360 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_368 = puVar2;
  ptStack_360 = &tStack_2c0;
  puVar2 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar2,0x11,&tStack_478);
  start_watcher(puVar2,0x11,&sStack_3f0,1);
  sStack_3f0.stop_or_close = NOOP;
  iVar1 = uv_run(puVar2,0);
  uStack_480 = (ulong)iVar1;
  uStack_488 = 0;
  if (uStack_480 == 0) {
    uStack_480 = (ulong)tStack_478.ncalls;
    uStack_488 = 10;
    if (uStack_480 != 10) goto LAB_001bd958;
    uStack_480 = 1;
    uStack_488 = (ulong)sStack_3f0.ncalls;
    if (uStack_488 != 1) goto LAB_001bd967;
    start_timer(puVar2,0x11,&tStack_478);
    iVar1 = uv_run(puVar2,0);
    uStack_480 = (ulong)iVar1;
    uStack_488 = 0;
    if (uStack_480 != 0) goto LAB_001bd976;
    uStack_480 = 1;
    uStack_488 = (ulong)sStack_3f0.ncalls;
    if (uStack_488 != 1) goto LAB_001bd985;
    sStack_3f0.stop_or_close = CLOSE;
    sStack_3f0.ncalls = 0;
    uv_signal_start_oneshot(&sStack_3f0.handle,signal_cb_one_shot,0x11);
    start_timer(puVar2,0x11,&tStack_478);
    iVar1 = uv_run(puVar2,0);
    uStack_480 = (ulong)iVar1;
    uStack_488 = 0;
    if (uStack_480 != 0) goto LAB_001bd994;
    uStack_480 = (ulong)tStack_478.ncalls;
    uStack_488 = 10;
    if (uStack_480 != 10) goto LAB_001bd9a3;
    uStack_480 = 1;
    uStack_488 = (ulong)sStack_3f0.ncalls;
    if (uStack_488 != 1) goto LAB_001bd9b2;
    uv_walk(puVar2,close_walk_cb,0);
    uv_run(puVar2,0);
    uStack_480 = 0;
    iVar1 = uv_loop_close(puVar2);
    uStack_488 = (ulong)iVar1;
    if (uStack_480 == uStack_488) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001bd958:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001bd967:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001bd976:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001bd985:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001bd994:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001bd9a3:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001bd9b2:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar4 = &uStack_480;
  iVar1 = (int)&uStack_488;
  run_test_we_get_signal_one_shot_cold_9();
  if (iVar1 == (int)puVar4[0xf]) {
    iVar1 = *(int *)((long)puVar4 + -4) + 1;
    *(int *)((long)puVar4 + -4) = iVar1;
    if (iVar1 == 1) {
      if ((int)puVar4[-1] == 0) {
        iVar1 = uv_close();
        return iVar1;
      }
      return 1;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_4d8 = puVar2;
  puVar2 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar2,0x11,&tStack_788);
  start_watcher(puVar2,0x11,&sStack_700,1);
  start_watcher(puVar2,0x11,&sStack_678,1);
  sStack_700.stop_or_close = CLOSE;
  sStack_678.stop_or_close = CLOSE;
  iVar1 = uv_run(puVar2,0);
  uStack_790 = (ulong)iVar1;
  if (uStack_790 == 0) {
    uStack_790 = (ulong)tStack_788.ncalls;
    if (uStack_790 != 10) goto LAB_001be0f0;
    uStack_790 = 1;
    if (sStack_700.ncalls != 1) goto LAB_001be0ff;
    uStack_790 = 1;
    if (sStack_678.ncalls != 1) goto LAB_001be10e;
    start_timer(puVar2,0x11,&tStack_788);
    start_watcher(puVar2,0x11,&sStack_700,1);
    start_watcher(puVar2,0x11,&sStack_678,1);
    sStack_700.stop_or_close = CLOSE;
    sStack_678.stop_or_close = CLOSE;
    start_watcher(puVar2,0x11,&sStack_5f0,0);
    uv_close(&sStack_5f0.handle,0);
    iVar1 = uv_run(puVar2,0);
    uStack_790 = (ulong)iVar1;
    if (uStack_790 != 0) goto LAB_001be11d;
    uStack_790 = (ulong)tStack_788.ncalls;
    if (uStack_790 != 10) goto LAB_001be12c;
    uStack_790 = 1;
    if (sStack_700.ncalls != 1) goto LAB_001be13b;
    uStack_790 = 1;
    if (sStack_678.ncalls != 1) goto LAB_001be14a;
    uStack_790 = (ulong)sStack_5f0.ncalls;
    if (uStack_790 != 0) goto LAB_001be159;
    start_timer(puVar2,0x11,&tStack_788);
    start_watcher(puVar2,0x11,&sStack_700,0);
    start_watcher(puVar2,0x11,&sStack_678,0);
    sStack_700.stop_or_close = CLOSE;
    sStack_678.stop_or_close = CLOSE;
    start_watcher(puVar2,0x11,&sStack_5f0,1);
    uv_close(&sStack_5f0.handle,0);
    iVar1 = uv_run(puVar2,0);
    uStack_790 = (ulong)iVar1;
    if (uStack_790 != 0) goto LAB_001be168;
    uStack_790 = (ulong)tStack_788.ncalls;
    if (uStack_790 != 10) goto LAB_001be177;
    uStack_790 = (ulong)sStack_700.ncalls;
    if (uStack_790 != 10) goto LAB_001be186;
    uStack_790 = (ulong)sStack_678.ncalls;
    if (uStack_790 != 10) goto LAB_001be195;
    uStack_790 = (ulong)sStack_5f0.ncalls;
    if (uStack_790 != 0) goto LAB_001be1a4;
    start_timer(puVar2,0x11,&tStack_788);
    start_watcher(puVar2,0x11,&sStack_700,0);
    start_watcher(puVar2,0x11,&sStack_678,0);
    start_watcher(puVar2,0x11,&sStack_5f0,1);
    start_watcher(puVar2,0x11,&sStack_568,1);
    sStack_5f0.stop_or_close = CLOSE;
    sStack_568.stop_or_close = CLOSE;
    uv_close(&sStack_700.handle,0);
    uv_close(&sStack_678.handle,0);
    iVar1 = uv_run(puVar2,0);
    uStack_790 = (ulong)iVar1;
    if (uStack_790 != 0) goto LAB_001be1b3;
    uStack_790 = (ulong)tStack_788.ncalls;
    if (uStack_790 != 10) goto LAB_001be1c2;
    uStack_790 = (ulong)sStack_700.ncalls;
    if (uStack_790 != 0) goto LAB_001be1d1;
    uStack_790 = (ulong)sStack_678.ncalls;
    if (uStack_790 != 0) goto LAB_001be1e0;
    uStack_790 = 1;
    if (sStack_5f0.ncalls != 1) goto LAB_001be1ef;
    uStack_790 = 1;
    start_timer(puVar2,0x11,&tStack_788);
    start_watcher(puVar2,0x11,&sStack_700,0);
    start_watcher(puVar2,0x11,&sStack_678,1);
    start_watcher(puVar2,0x11,&sStack_5f0,0);
    start_watcher(puVar2,0x11,&sStack_568,0);
    sStack_568.stop_or_close = CLOSE;
    uv_close(&sStack_700.handle,0);
    uv_close(&sStack_5f0.handle,0);
    iVar1 = uv_run(puVar2,0);
    uStack_790 = (ulong)iVar1;
    if (uStack_790 != 0) goto LAB_001be20d;
    uStack_790 = (ulong)tStack_788.ncalls;
    if (uStack_790 != 10) goto LAB_001be21c;
    uStack_790 = (ulong)sStack_700.ncalls;
    if (uStack_790 != 0) goto LAB_001be22b;
    uStack_790 = 1;
    if (sStack_678.ncalls != 1) goto LAB_001be23a;
    uStack_790 = (ulong)sStack_5f0.ncalls;
    if (uStack_790 != 0) goto LAB_001be249;
    uStack_790 = (ulong)sStack_568.ncalls;
    if (uStack_790 == 10) {
      uv_walk(puVar2,close_walk_cb,0);
      uv_run(puVar2,0);
      uStack_790 = 0;
      iVar1 = uv_loop_close(puVar2);
      if (uStack_790 == (long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001be267;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001be0f0:
    run_test_we_get_signals_mixed_cold_2();
LAB_001be0ff:
    run_test_we_get_signals_mixed_cold_3();
LAB_001be10e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001be11d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001be12c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001be13b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001be14a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001be159:
    run_test_we_get_signals_mixed_cold_9();
LAB_001be168:
    run_test_we_get_signals_mixed_cold_10();
LAB_001be177:
    run_test_we_get_signals_mixed_cold_11();
LAB_001be186:
    run_test_we_get_signals_mixed_cold_12();
LAB_001be195:
    run_test_we_get_signals_mixed_cold_13();
LAB_001be1a4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001be1b3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001be1c2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001be1d1:
    run_test_we_get_signals_mixed_cold_17();
LAB_001be1e0:
    run_test_we_get_signals_mixed_cold_18();
LAB_001be1ef:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001be20d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001be21c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001be22b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001be23a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001be249:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001be267:
  puVar4 = &uStack_790;
  run_test_we_get_signals_mixed_cold_27();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar4,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(we_get_signals) {
  struct signal_ctx sc[4];
  struct timer_ctx tc[2];
  uv_loop_t* loop;
  unsigned int i;

  loop = uv_default_loop();
  start_watcher(loop, SIGUSR1, sc + 0, 0);
  start_watcher(loop, SIGUSR1, sc + 1, 0);
  start_watcher(loop, SIGUSR2, sc + 2, 0);
  start_watcher(loop, SIGUSR2, sc + 3, 0);
  start_timer(loop, SIGUSR1, tc + 0);
  start_timer(loop, SIGUSR2, tc + 1);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  for (i = 0; i < ARRAY_SIZE(sc); i++)
    ASSERT_EQ(sc[i].ncalls, NSIGNALS);

  for (i = 0; i < ARRAY_SIZE(tc); i++)
    ASSERT_EQ(tc[i].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}